

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderResourceCacheGL::SetUniformBuffer
          (ShaderResourceCacheGL *this,Uint32 CacheOffset,
          RefCntAutoPtr<Diligent::BufferGLImpl> *pBuff,Uint64 BaseOffset,Uint64 RangeSize)

{
  uint uVar1;
  BufferGLImpl *pBVar2;
  CachedUB *this_00;
  Uint64 UVar3;
  ulong uVar4;
  Uint64 RangeSize_local;
  Uint64 BaseOffset_local;
  string msg;
  
  pBVar2 = pBuff->m_pObject;
  if (pBVar2 == (BufferGLImpl *)0x0) {
    UVar3 = 0;
  }
  else {
    UVar3 = (pBVar2->super_BufferBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
            .m_Desc.Size;
  }
  RangeSize_local = RangeSize;
  BaseOffset_local = BaseOffset;
  if (UVar3 < BaseOffset + RangeSize) {
    FormatString<char[34]>(&msg,(char (*) [34])"The range is out of buffer bounds");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetUniformBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
               ,0x97);
    std::__cxx11::string::~string((string *)&msg);
    pBVar2 = pBuff->m_pObject;
  }
  if (RangeSize == 0 && pBVar2 != (BufferGLImpl *)0x0) {
    RangeSize_local =
         (pBVar2->super_BufferBase<Diligent::EngineGLImplTraits>).
         super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
         .m_Desc.Size - BaseOffset;
  }
  this_00 = GetConstUB(this,CacheOffset);
  RefCntAutoPtr<Diligent::BufferGLImpl>::operator=(&this_00->pBuffer,pBuff);
  uVar1 = StaticCast<unsigned_int,unsigned_long>(&BaseOffset_local);
  this_00->BaseOffset = uVar1;
  uVar1 = StaticCast<unsigned_int,unsigned_long>(&RangeSize_local);
  this_00->RangeSize = uVar1;
  this_00->DynamicOffset = 0;
  uVar4 = 1L << ((byte)CacheOffset & 0x3f);
  if ((this->m_DynamicUBOSlotMask >> ((ulong)CacheOffset & 0x3f) & 1) == 0) {
    if ((this->m_DynamicUBOMask & uVar4) != 0) {
      FormatString<char[94]>
                (&msg,(char (*) [94])
                      "Dynamic UBO bit should never be set when corresponding bit in m_DynamicUBOSlotMask is not set"
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetUniformBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
                 ,0xb1);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  else {
    pBVar2 = (this_00->pBuffer).m_pObject;
    if ((pBVar2 == (BufferGLImpl *)0x0) ||
       ((pBVar2->super_BufferBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
        .m_Desc.Size <= (ulong)uVar1)) {
      this->m_DynamicUBOMask = this->m_DynamicUBOMask & ~uVar4;
    }
    else {
      this->m_DynamicUBOMask = this->m_DynamicUBOMask | uVar4;
    }
  }
  LOCK();
  (this->super_ShaderResourceCacheBase).m_DvpRevision.super___atomic_base<unsigned_int>._M_i =
       (this->super_ShaderResourceCacheBase).m_DvpRevision.super___atomic_base<unsigned_int>._M_i +
       1;
  UNLOCK();
  return;
}

Assistant:

void SetUniformBuffer(Uint32 CacheOffset, RefCntAutoPtr<BufferGLImpl>&& pBuff, Uint64 BaseOffset, Uint64 RangeSize)
    {
        DEV_CHECK_ERR(BaseOffset + RangeSize <= (pBuff ? pBuff->GetDesc().Size : 0), "The range is out of buffer bounds");
        if (pBuff)
        {
            if (RangeSize == 0)
                RangeSize = pBuff->GetDesc().Size - BaseOffset;
        }

        auto& UB = GetUB(CacheOffset);

        UB.pBuffer       = std::move(pBuff);
        UB.BaseOffset    = StaticCast<Uint32>(BaseOffset);
        UB.RangeSize     = StaticCast<Uint32>(RangeSize);
        UB.DynamicOffset = 0;

        Uint64 UBBit = Uint64{1} << Uint64{CacheOffset};
        if (m_DynamicUBOSlotMask & UBBit)
        {
            // Only set the flag for those slots that allow dynamic buffers
            // (i.e. the variable was not created with NO_DYNAMIC_BUFFERS flag).
            if (UB.IsDynamic())
                m_DynamicUBOMask |= UBBit;
            else
                m_DynamicUBOMask &= ~UBBit;
        }
        else
        {
            VERIFY((m_DynamicUBOMask & UBBit) == 0, "Dynamic UBO bit should never be set when corresponding bit in m_DynamicUBOSlotMask is not set");
        }
        UpdateRevision();
    }